

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O2

void __thiscall
Args::HelpPrinter::printString
          (HelpPrinter *this,OutStreamType *to,StringList *words,size_type currentPos,
          size_type leftMargin,size_type rightMargin)

{
  pointer pbVar1;
  pointer word;
  bool makeOffset;
  size_type maxLineLength;
  size_type rightMargin_local;
  size_type leftMargin_local;
  size_type currentPos_local;
  size_type length;
  anon_class_64_8_a3d8de13 local_68;
  
  maxLineLength = 0;
  if (rightMargin + leftMargin <= this->m_lineLength) {
    maxLineLength = this->m_lineLength - (rightMargin + leftMargin);
  }
  rightMargin_local = rightMargin;
  leftMargin_local = leftMargin;
  currentPos_local = currentPos;
  if (maxLineLength < 0x14) {
    std::operator<<(to,"\n\n");
    currentPos_local = 0;
    maxLineLength = this->m_lineLength - 0x14;
    rightMargin_local = 0;
    leftMargin_local = 0x14;
  }
  local_68.length = &length;
  length = 0;
  makeOffset = currentPos_local < leftMargin_local;
  local_68.makeOffset = &makeOffset;
  pbVar1 = (words->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_68.currentPos = &currentPos_local;
  local_68.leftMargin = &leftMargin_local;
  local_68.maxLineLength = &maxLineLength;
  local_68.rightMargin = &rightMargin_local;
  local_68.to = to;
  local_68.this = this;
  for (word = (words->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; word != pbVar1; word = word + 1) {
    printString::anon_class_64_8_a3d8de13::operator()(&local_68,word);
  }
  return;
}

Assistant:

inline void
HelpPrinter::printString( OutStreamType & to,
	const StringList & words,
	String::size_type currentPos, String::size_type leftMargin,
	String::size_type rightMargin ) const
{
	const String::size_type occupied = leftMargin + rightMargin;

	String::size_type maxLineLength = ( occupied < m_lineLength ?
		m_lineLength - occupied : 0 );

	if( maxLineLength < 20 )
	{
		to << "\n\n";

		maxLineLength = m_lineLength - 20;

		currentPos = 0;
		leftMargin = 20;
		rightMargin = 0;
	}

	String::size_type length = 0;

	bool makeOffset = ( currentPos < leftMargin );

	std::for_each( words.cbegin(), words.cend(),
		[ & ] ( const String & word )
		{
			if( makeOffset )
			{
				printOffset( to, currentPos, leftMargin );

				makeOffset = false;
			}

			if( length + word.length() < maxLineLength )
			{
				length += word.length();

				to << word;

				if( length < maxLineLength )
				{
					++length;
					to << ' ';
				}
			}
			else
			{
				currentPos = 0;

				length = 0;

				maxLineLength = m_lineLength - leftMargin - rightMargin;

				to << "\n";

				printOffset( to, currentPos, leftMargin );

				to << word;

				length += word.length();

				if( length < maxLineLength )
				{
					++length;
					to << ' ';
				}
			}
		}
	);
}